

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O1

WebPMuxError MuxSet(WebPMux *mux,uint32_t tag,WebPData *data,int copy_data)

{
  CHUNK_INDEX CVar1;
  WebPMuxError WVar2;
  long lVar3;
  WebPChunk chunk;
  WebPChunk WStack_48;
  
  CVar1 = ChunkGetIndexFromTag(tag);
  ChunkInit(&WStack_48);
  WVar2 = WEBP_MUX_NOT_FOUND;
  switch(CVar1) {
  case IDX_VP8X:
    WVar2 = ChunkAssignData(&WStack_48,data,copy_data,tag);
    lVar3 = 0x28;
    break;
  case IDX_ICCP:
    WVar2 = ChunkAssignData(&WStack_48,data,copy_data,tag);
    lVar3 = 8;
    break;
  case IDX_ANIM:
    WVar2 = ChunkAssignData(&WStack_48,data,copy_data,tag);
    lVar3 = 0x20;
    break;
  default:
    goto switchD_0014f155_caseD_3;
  case IDX_EXIF:
    WVar2 = ChunkAssignData(&WStack_48,data,copy_data,tag);
    lVar3 = 0x10;
    break;
  case IDX_XMP:
    WVar2 = ChunkAssignData(&WStack_48,data,copy_data,tag);
    lVar3 = 0x18;
    break;
  case IDX_UNKNOWN:
    WVar2 = ChunkAssignData(&WStack_48,data,copy_data,tag);
    lVar3 = 0x30;
  }
  if (WVar2 == WEBP_MUX_OK) {
    WVar2 = ChunkSetHead(&WStack_48,(WebPChunk **)((long)&mux->images_ + lVar3));
  }
switchD_0014f155_caseD_3:
  return WVar2;
}

Assistant:

static WebPMuxError MuxSet(WebPMux* const mux, uint32_t tag,
                           const WebPData* const data, int copy_data) {
  WebPChunk chunk;
  WebPMuxError err = WEBP_MUX_NOT_FOUND;
  const CHUNK_INDEX idx = ChunkGetIndexFromTag(tag);
  assert(mux != NULL);
  assert(!IsWPI(kChunks[idx].id));

  ChunkInit(&chunk);
  SWITCH_ID_LIST(IDX_VP8X,    &mux->vp8x_);
  SWITCH_ID_LIST(IDX_ICCP,    &mux->iccp_);
  SWITCH_ID_LIST(IDX_ANIM,    &mux->anim_);
  SWITCH_ID_LIST(IDX_EXIF,    &mux->exif_);
  SWITCH_ID_LIST(IDX_XMP,     &mux->xmp_);
  SWITCH_ID_LIST(IDX_UNKNOWN, &mux->unknown_);
  return err;
}